

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

FILE * open_file_with_retries(char *pFilename,char *pMode)

{
  FILE *pFVar1;
  int iVar2;
  
  iVar2 = 8;
  do {
    pFVar1 = fopen64(pFilename,"rb");
    if (pFVar1 != (FILE *)0x0) {
      return (FILE *)pFVar1;
    }
    usleep(250000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return (FILE *)0x0;
}

Assistant:

static FILE* open_file_with_retries(const char *pFilename, const char* pMode)
{
   const uint cNumRetries = 8;
   for (uint i = 0; i < cNumRetries; i++)
   {
      FILE* pFile = fopen(pFilename, pMode);
      if (pFile)
         return pFile;
      Sleep(250);
   }
   return NULL;
}